

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void applyNumericAffinity(Mem *pRec,int bTryForInt)

{
  u8 enc;
  undefined2 uVar1;
  char *z;
  ushort uVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  i64 iValue;
  double rValue;
  MemValue local_38;
  double local_30;
  
  z = pRec->z;
  iVar4 = pRec->n;
  enc = pRec->enc;
  iVar3 = sqlite3AtoF(z,&local_30,iVar4,enc);
  if (iVar3 != 0) {
    iVar4 = sqlite3Atoi64(z,&local_38.i,iVar4,enc);
    if (iVar4 == 0) {
      pRec->u = local_38;
      uVar2 = pRec->flags;
    }
    else {
      (pRec->u).r = local_30;
      uVar1 = pRec->flags;
      pRec->flags = uVar1 | 8;
      if (bTryForInt == 0) {
        return;
      }
      if (9.223372036854776e+18 <= ABS(local_30)) {
        return;
      }
      lVar5 = (long)local_30;
      if (0xfffffffffffffffd < lVar5 + 0x7fffffffffffffffU || local_30 != (double)lVar5) {
        return;
      }
      (pRec->u).i = lVar5;
      uVar2 = uVar1 & 0x3e00;
    }
    pRec->flags = uVar2 | 4;
  }
  return;
}

Assistant:

static void applyNumericAffinity(Mem *pRec, int bTryForInt){
  double rValue;
  i64 iValue;
  u8 enc = pRec->enc;
  assert( (pRec->flags & (MEM_Str|MEM_Int|MEM_Real))==MEM_Str );
  if( sqlite3AtoF(pRec->z, &rValue, pRec->n, enc)==0 ) return;
  if( 0==sqlite3Atoi64(pRec->z, &iValue, pRec->n, enc) ){
    pRec->u.i = iValue;
    pRec->flags |= MEM_Int;
  }else{
    pRec->u.r = rValue;
    pRec->flags |= MEM_Real;
    if( bTryForInt ) sqlite3VdbeIntegerAffinity(pRec);
  }
}